

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

int __thiscall
TPZSkylMatrix<std::complex<double>_>::Subst_Forward
          (TPZSkylMatrix<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *B)

{
  complex<double> **ppcVar1;
  complex<double> *pcVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  complex<double> *pcVar5;
  complex<double> *__y;
  long lVar6;
  complex<double> *pcVar7;
  long col;
  long lVar8;
  long row;
  double extraout_XMM0_Qa;
  double dVar9;
  double local_78;
  double dStack_70;
  undefined1 local_40 [16];
  int extraout_var_00;
  
  lVar6 = (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
  iVar3 = (*(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])();
  if ((lVar6 != CONCAT44(extraout_var,iVar3)) ||
     ((this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fDecomposed != '\x03')) {
    TPZMatrix<std::complex<double>_>::Error
              ("virtual int TPZSkylMatrix<std::complex<double>>::Subst_Forward(TPZFMatrix<TVar> *) const [TVar = std::complex<double>]"
               ,"TPZSkylMatrix::Subst_Forward not decomposed with cholesky");
  }
  iVar3 = (*(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])(this);
  lVar4 = CONCAT44(extraout_var_00,iVar3);
  col = 0;
  lVar6 = 0;
  if (lVar4 != 0 && -1 < extraout_var_00) {
    lVar6 = lVar4;
  }
  do {
    if ((B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <= col) {
      return 1;
    }
    for (lVar8 = 0; row = lVar6, lVar6 != lVar8; lVar8 = lVar8 + 1) {
      pcVar5 = TPZFMatrix<std::complex<double>_>::operator()(B,lVar8,col);
      row = lVar8;
      if ((((*(double *)pcVar5->_M_value != 0.0) || (NAN(*(double *)pcVar5->_M_value))) ||
          (*(double *)(pcVar5->_M_value + 8) != 0.0)) || (NAN(*(double *)(pcVar5->_M_value + 8))))
      break;
    }
    lVar8 = row;
    if (row < lVar4) {
      lVar8 = lVar4;
    }
    while (row != lVar8) {
      ppcVar1 = (this->fElem).fStore;
      pcVar5 = ppcVar1[row];
      pcVar2 = ppcVar1[row + 1];
      __y = TPZFMatrix<std::complex<double>_>::operator()(B,row,col);
      local_78 = 0.0;
      dStack_70 = 0.0;
      while( true ) {
        __y = __y + -1;
        pcVar7 = pcVar5 + 1;
        if (pcVar2 <= pcVar7) break;
        local_40._0_8_ = *(undefined8 *)pcVar7->_M_value;
        dVar9 = -*(double *)(pcVar5[1]._M_value + 8);
        local_40._8_8_ = dVar9;
        std::operator*((complex<double> *)local_40,__y);
        local_78 = local_78 + extraout_XMM0_Qa;
        dStack_70 = dStack_70 + dVar9;
        pcVar5 = pcVar7;
      }
      pcVar5 = TPZFMatrix<std::complex<double>_>::operator()(B,row,col);
      dVar9 = *(double *)(pcVar5->_M_value + 8);
      *(double *)pcVar5->_M_value = *(double *)pcVar5->_M_value - local_78;
      *(double *)(pcVar5->_M_value + 8) = dVar9 - dStack_70;
      std::complex<double>::operator/=(pcVar5,(this->fElem).fStore[row]);
      row = row + 1;
    }
    col = col + 1;
  } while( true );
}

Assistant:

int
TPZSkylMatrix<TVar>::Subst_Forward( TPZFMatrix<TVar> *B ) const
{
    if ( (B->Rows() != this->Dim()) || this->fDecomposed != ECholesky)
        TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"TPZSkylMatrix::Subst_Forward not decomposed with cholesky");
    
#ifdef DUMP_BEFORE_SUBST
    dump_matrices(this, B, "TPZSkylMatrix::Subst_Forward(B)");
#endif
    
    //	std::cout << "SubstForward this " << (void *) this << " neq " << Dim() << " normb " << Norm(*B) << std::endl;
    int64_t dimension=this->Dim();
    for ( int64_t j = 0; j < B->Cols(); j++ )
    {
        int64_t k=0;
        while (k<dimension && (*B)(k,j) == TVar(0)) {
            k++;
        }
        //		std::cout << "kstart " << k << std::endl;
        for (; k < dimension; k++ )
        {
            // Faz sum = SOMA( A[k,i] * B[i,j] ), para i = 1, ..., k-1.
            //
            TVar sum = 0.0;
            TVar *elem_ki = fElem[k]+1;
            TVar *end_ki  = fElem[k+1];
            TVar* BPtr = &(*B)(k,j);   //(k-1,j)
            //	for ( int i = k-1; elem_ki < end_ki; i-- )
            //	  sum += (*elem_ki++) * B->GetVal( i, j );
            
            //EBORIN:
            // Is this a hot-spot?
            // Is it vectorized?
            if constexpr(is_complex<TVar>::value)
                while(elem_ki < end_ki) sum += std::conj(*elem_ki++) * (*--BPtr);//(*BPtr--)
            else
                while(elem_ki < end_ki) sum += (*elem_ki++) * (*--BPtr);//(*BPtr--)
            // Faz B[k,j] = (B[k,j] - sum) / A[k,k].
            //
            //	B->PutVal( k, j, (B->GetVal(k, j) - sum) / row_k->pElem[0] );
            BPtr = &(*B)(k,j);
            *BPtr-= sum;
            *BPtr /= fElem[k][0];
        }
    }
    
    return( 1 );
}